

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O2

void __thiscall
lr_grammar::GrammarLR::get_follow_by_first
          (GrammarLR *this,int elemIndex,ExpressLR *express,int begin,
          vector<int,_std::allocator<int>_> *result)

{
  pointer piVar1;
  bool bVar2;
  int *piVar3;
  ulong uVar4;
  int index;
  ulong uVar5;
  int elemIndex_local;
  vector<int,_std::allocator<int>_> tmp;
  
  piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  elemIndex_local = elemIndex;
  piVar3 = base_grammar::Express::operator[](&express->super_Express,0);
  if (*piVar3 != -1) {
    for (uVar5 = (ulong)begin;
        uVar4 = (long)(express->super_Express).expression.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish -
                (long)(express->super_Express).expression.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start >> 2, uVar5 < uVar4; uVar5 = uVar5 + 1) {
      index = (int)uVar5;
      piVar3 = base_grammar::Express::operator[](&express->super_Express,index);
      bVar2 = public_tool::is_in_vector
                        ((this->first).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + *piVar3,-1);
      if (!bVar2) {
        piVar3 = base_grammar::Express::operator[](&express->super_Express,index);
        public_tool::connect_vector
                  (result,(this->first).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + *piVar3);
        uVar4 = (long)(express->super_Express).expression.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish -
                (long)(express->super_Express).expression.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start >> 2;
        break;
      }
      piVar3 = base_grammar::Express::operator[](&express->super_Express,index);
      clear_null((this->first).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *piVar3,&tmp,-1);
      public_tool::connect_vector(result,&tmp);
    }
    if (uVar4 != uVar5) goto LAB_00109e60;
  }
  std::vector<int,_std::allocator<int>_>::push_back(result,&elemIndex_local);
LAB_00109e60:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tmp.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void GrammarLR::get_follow_by_first(int elemIndex, ExpressLR express, int begin, vector<int>& result){
    result.clear();
    vector<int> tmp;

    //如果是一个空串的话
    if (express[0] == -1){
        result.push_back(elemIndex);
        return;
    }

    for (begin = begin; begin < express.expression.size(); begin++){

        //如果空不在退出
        if (!public_tool::is_in_vector(first[express[begin]], -1)){
            public_tool::connect_vector(result, first[express[begin]]);
            break;
        }
        else
        {
            clear_null(first[express[begin]], tmp);
            public_tool::connect_vector(result, tmp);
        }

    }
    if (begin == express.expression.size()){
        //result.push_back(-1);
        result.push_back(elemIndex);
    }

}